

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_CPY_z_i(DisasContext_conflict1 *s,arg_CPY_z_i *a)

{
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i64 c;
  _Bool _Var2;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((a->esz == 0) && ((s->insn & 0x2000) != 0)) {
    _Var2 = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    _Var2 = true;
    if (_Var1) {
      oprsz = s->sve_len;
      c = tcg_const_i64_aarch64(tcg_ctx,(long)a->imm);
      tcg_gen_gvec_2i_ool_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->pg * 0x20 + 0x2c10,c,oprsz,oprsz,0,
                 trans_CPY_z_i::fns[a->esz]);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c + (long)tcg_ctx));
    }
  }
  return _Var2;
}

Assistant:

static bool trans_CPY_z_i(DisasContext *s, arg_CPY_z_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_2i * const fns[4] = {
        gen_helper_sve_cpy_z_b, gen_helper_sve_cpy_z_h,
        gen_helper_sve_cpy_z_s, gen_helper_sve_cpy_z_d,
    };

    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i64 t_imm = tcg_const_i64(tcg_ctx, a->imm);
        tcg_gen_gvec_2i_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                            pred_full_reg_offset(s, a->pg),
                            t_imm, vsz, vsz, 0, fns[a->esz]);
        tcg_temp_free_i64(tcg_ctx, t_imm);
    }
    return true;
}